

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

bool __thiscall xla::GraphCycles::IsReachableNonConst(GraphCycles *this,int32_t x,int32_t y)

{
  Rep *r_00;
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  bool reachable;
  Node *ny;
  Node *nx;
  Rep *r;
  int32_t y_local;
  int32_t x_local;
  GraphCycles *this_local;
  
  if (x == y) {
    this_local._7_1_ = true;
  }
  else {
    r_00 = this->rep_;
    pvVar2 = std::
             vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
             ::operator[](&r_00->nodes_,(long)x);
    pvVar3 = std::
             vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
             ::operator[](&r_00->nodes_,(long)y);
    if (pvVar2->rank < pvVar3->rank) {
      bVar1 = ForwardDFS(r_00,x,pvVar3->rank);
      this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
      ClearVisitedBits(r_00,&r_00->deltaf_);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool GraphCycles::IsReachableNonConst(int32_t x, int32_t y) {
  if (x == y) return true;
  Rep* r = rep_;
  Node* nx = &r->nodes_[x];
  Node* ny = &r->nodes_[y];

  if (nx->rank >= ny->rank) {
    // x cannot reach y since it is after it in the topological ordering
    return false;
  }

  // See if x can reach y using a DFS search that is limited to y's rank
  bool reachable = !ForwardDFS(r, x, ny->rank);

  // Clear any visited markers left by ForwardDFS.
  ClearVisitedBits(r, r->deltaf_);
  return reachable;
}